

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O1

void google::protobuf::compiler::javanano::anon_unknown_3::LoadEnumValues
               (Params *params,EnumDescriptor *enum_descriptor,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *canonical_values)

{
  size_type *psVar1;
  long lVar2;
  EnumValueDescriptor *pEVar3;
  undefined8 *puVar4;
  EnumDescriptor *in_RCX;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  EnumValueDescriptor *pEVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string enum_class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)canonical_values;
  ClassName_abi_cxx11_(&local_50,(javanano *)params,(Params *)enum_descriptor,in_RCX);
  if (0 < *(int *)(enum_descriptor + 0x2c)) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      lVar2 = *(long *)(enum_descriptor + 0x30);
      pEVar3 = EnumDescriptor::FindValueByNumber(enum_descriptor,*(int *)(lVar2 + 0x10 + lVar6));
      pEVar9 = (EnumValueDescriptor *)(lVar2 + lVar6);
      if (pEVar9 == pEVar3) {
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_50._M_dataplus._M_p,
                   local_50._M_dataplus._M_p + local_50._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        RenameJavaKeywords(&local_98,*(string **)pEVar9);
        uVar7 = 0xf;
        if (local_78 != local_68) {
          uVar7 = local_68[0];
        }
        if (uVar7 < local_98._M_string_length + local_70) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar8 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_98._M_string_length + local_70) goto LAB_002bb7d9;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
        }
        else {
LAB_002bb7d9:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_78,(ulong)local_98._M_dataplus._M_p);
        }
        psVar1 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8.field_2._8_8_ = puVar4[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar1;
          local_b8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_b8._M_string_length = puVar4[1];
        *puVar4 = psVar1;
        puVar4[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_58,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (lVar5 < *(int *)(enum_descriptor + 0x2c));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LoadEnumValues(const Params& params,
    const EnumDescriptor* enum_descriptor, vector<string>* canonical_values) {
  string enum_class_name = ClassName(params, enum_descriptor);
  for (int i = 0; i < enum_descriptor->value_count(); i++) {
    const EnumValueDescriptor* value = enum_descriptor->value(i);
    const EnumValueDescriptor* canonical_value =
        enum_descriptor->FindValueByNumber(value->number());
    if (value == canonical_value) {
      canonical_values->push_back(
          enum_class_name + "." + RenameJavaKeywords(value->name()));
    }
  }
}